

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O2

bool notExist(btVector3 *planeEquation,btAlignedObjectArray<btVector3> *planeEquations)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  btScalar bVar6;
  
  uVar1 = planeEquations->m_size;
  lVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (uVar5 == uVar3) break;
    bVar6 = btVector3::dot(planeEquation,
                           (btVector3 *)((long)planeEquations->m_data->m_floats + lVar4));
    lVar4 = lVar4 + 0x10;
    uVar2 = uVar3 + 1;
  } while (bVar6 <= 0.999);
  return (long)(int)uVar1 <= (long)uVar3;
}

Assistant:

bool notExist(const btVector3& planeEquation,const btAlignedObjectArray<btVector3>& planeEquations)
{
	int numbrushes = planeEquations.size();
	for (int i=0;i<numbrushes;i++)
	{
		const btVector3& N1 = planeEquations[i];
		if (planeEquation.dot(N1) > btScalar(0.999))
		{
			return false;
		} 
	}
	return true;
}